

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

void Saig_ManBmcWriteBlif(Aig_Man_t *p,Vec_Int_t *vMapping,char *pFileName)

{
  uint uVar1;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  FILE *__s;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  char cVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char **pSops;
  char *pSopSizes;
  char Vals [4];
  char **local_60;
  char *local_58;
  char acStack_4d [5];
  Vec_Int_t *local_48;
  Aig_Man_t *local_40;
  ulong local_38;
  
  pcVar9 = pFileName;
  __s = fopen(pFileName,"w");
  if (__s == (FILE *)0x0) {
    Abc_Print((int)pcVar9,"Cannot open file %s\n",pFileName);
    return;
  }
  local_48 = vMapping;
  fwrite(".model test\n",0xc,1,__s);
  fwrite(".inputs",7,1,__s);
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      fprintf(__s," n%d",(ulong)*(uint *)((long)pVVar5->pArray[lVar12] + 0x24));
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCis;
    } while (lVar12 < pVVar5->nSize);
  }
  fputc(10,__s);
  fwrite(".outputs",8,1,__s);
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      fprintf(__s," n%d",(ulong)*(uint *)((long)pVVar5->pArray[lVar12] + 0x24));
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCos;
    } while (lVar12 < pVVar5->nSize);
  }
  fputc(10,__s);
  fwrite(".names",6,1,__s);
  fprintf(__s," n%d\n",(ulong)(uint)p->pConst1->Id);
  fwrite(" 1\n",3,1,__s);
  Cnf_ReadMsops(&local_58,&local_60);
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    local_40 = p;
    do {
      if ((pVVar5->pArray[lVar12] != (void *)0x0) &&
         (0xfffffffd < (*(uint *)((long)pVVar5->pArray[lVar12] + 0x18) & 7) - 7)) {
        if (local_48->nSize <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar2 = local_48->pArray;
        uVar1 = piVar2[lVar12];
        uVar10 = (ulong)uVar1;
        if (uVar10 != 0) {
          if (((int)uVar1 < 0) || (local_48->nSize <= (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          fwrite(".names",6,1,__s);
          uVar11 = 0;
          do {
            if (piVar2[uVar10 + uVar11 + 1] < 0) goto LAB_0055e948;
            uVar11 = uVar11 + 1;
            fprintf(__s," n%d");
          } while (uVar11 != 4);
          uVar11 = 4;
LAB_0055e948:
          fprintf(__s," n%d\n",lVar12);
          if ('\0' < local_58[*(ushort *)(piVar2 + uVar10)]) {
            lVar7 = 0;
            local_38 = (ulong)*(ushort *)(piVar2 + uVar10);
            do {
              lVar6 = 4;
              iVar4 = (int)local_60[local_38][lVar7];
              do {
                cVar8 = (iVar4 % 3 == 1) * '\x04' + '-';
                if (iVar4 == (iVar4 / 3) * 3) {
                  cVar8 = '0';
                }
                acStack_4d[lVar6] = cVar8;
                lVar6 = lVar6 + -1;
                iVar4 = iVar4 / 3;
              } while (lVar6 != 0);
              if ((int)uVar11 != 0) {
                uVar10 = 0;
                do {
                  fputc((int)acStack_4d[uVar10 + 1],__s);
                  uVar10 = uVar10 + 1;
                } while ((uVar11 & 0xffffffff) != uVar10);
              }
              fwrite(" 1\n",3,1,__s);
              lVar7 = lVar7 + 1;
            } while (lVar7 < local_58[local_38]);
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar5 = local_40->vObjs;
      p = local_40;
    } while (lVar12 < pVVar5->nSize);
  }
  free(local_58);
  free(local_60[1]);
  free(local_60);
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar12];
      fwrite(".names",6,1,__s);
      fprintf(__s," n%d",
              (ulong)*(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x24));
      fprintf(__s," n%d\n",(ulong)*(uint *)((long)pvVar3 + 0x24));
      fprintf(__s,"%d 1\n",(ulong)(~*(uint *)((long)pvVar3 + 8) & 1));
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCos;
    } while (lVar12 < pVVar5->nSize);
  }
  fwrite(".end\n",5,1,__s);
  fclose(__s);
  return;
}

Assistant:

void Saig_ManBmcWriteBlif( Aig_Man_t * p, Vec_Int_t * vMapping, char * pFileName )
{
    FILE * pFile;
    char * pSopSizes, ** pSops;
    Aig_Obj_t * pObj;
    char Vals[4];
    int i, k, b, iFan, iTruth, * pData;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file %s\n", pFileName );
        return;
    }
    fprintf( pFile, ".model test\n" );
    fprintf( pFile, ".inputs" );
    Aig_ManForEachCi( p, pObj, i )
        fprintf( pFile, " n%d", Aig_ObjId(pObj) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    Aig_ManForEachCo( p, pObj, i )
        fprintf( pFile, " n%d", Aig_ObjId(pObj) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".names" );
    fprintf( pFile, " n%d\n", Aig_ObjId(Aig_ManConst1(p)) );
    fprintf( pFile, " 1\n" );

    Cnf_ReadMsops( &pSopSizes, &pSops );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Vec_IntEntry(vMapping, i) == 0 )
            continue;
        pData = Vec_IntEntryP( vMapping, Vec_IntEntry(vMapping, i) );
        fprintf( pFile, ".names" );
        for ( iFan = 0; iFan < 4; iFan++ )
            if ( pData[iFan+1] >= 0 )
                fprintf( pFile, " n%d", pData[iFan+1] );
            else
                break;
        fprintf( pFile, " n%d\n", i );
        // write SOP
        iTruth = pData[0] & 0xffff;
        for ( k = 0; k < pSopSizes[iTruth]; k++ )
        {
            int Lit = pSops[iTruth][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Lit % 3 == 0 )
                    Vals[b] = '0';
                else if ( Lit % 3 == 1 )
                    Vals[b] = '1';
                else
                    Vals[b] = '-';
                Lit = Lit / 3;
            }
            for ( b = 0; b < iFan; b++ )
                fprintf( pFile, "%c", Vals[b] );
            fprintf( pFile, " 1\n" );
        }
    }
    free( pSopSizes );
    free( pSops[1] );
    free( pSops );

    Aig_ManForEachCo( p, pObj, i )
    {
        fprintf( pFile, ".names" );
        fprintf( pFile, " n%d", Aig_ObjId(Aig_ObjFanin0(pObj)) );
        fprintf( pFile, " n%d\n", Aig_ObjId(pObj) );
        fprintf( pFile, "%d 1\n", !Aig_ObjFaninC0(pObj) );
    }
    fprintf( pFile, ".end\n" );
    fclose( pFile );
}